

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void setCursorMode(_GLFWwindow *window,int newMode)

{
  int local_20;
  int local_1c;
  int height;
  int width;
  int oldMode;
  int newMode_local;
  _GLFWwindow *window_local;
  
  height = window->cursorMode;
  width = newMode;
  _oldMode = window;
  if (((newMode == 0x34001) || (newMode == 0x34002)) || (newMode == 0x34003)) {
    if ((height != newMode) && (window->cursorMode = newMode, window == _glfw.focusedWindow)) {
      if (height == 0x34003) {
        window->cursorPosX = _glfw.cursorPosX;
        window->cursorPosY = _glfw.cursorPosY;
        _glfwPlatformSetCursorPos(window,_glfw.cursorPosX,_glfw.cursorPosY);
      }
      else if (newMode == 0x34003) {
        _glfw.cursorPosX = window->cursorPosX;
        _glfw.cursorPosY = window->cursorPosY;
        _glfwPlatformGetWindowSize(window,&local_1c,&local_20);
        _glfwPlatformSetCursorPos(_oldMode,(double)local_1c / 2.0,(double)local_20 / 2.0);
      }
      _glfwPlatformSetCursorMode(_oldMode,width);
    }
  }
  else {
    _glfwInputError(0x10003,(char *)0x0);
  }
  return;
}

Assistant:

static void setCursorMode(_GLFWwindow* window, int newMode)
{
    const int oldMode = window->cursorMode;

    if (newMode != GLFW_CURSOR_NORMAL &&
        newMode != GLFW_CURSOR_HIDDEN &&
        newMode != GLFW_CURSOR_DISABLED)
    {
        _glfwInputError(GLFW_INVALID_ENUM, NULL);
        return;
    }

    if (oldMode == newMode)
        return;

    window->cursorMode = newMode;

    if (window == _glfw.focusedWindow)
    {
        if (oldMode == GLFW_CURSOR_DISABLED)
        {
            window->cursorPosX = _glfw.cursorPosX;
            window->cursorPosY = _glfw.cursorPosY;

            _glfwPlatformSetCursorPos(window, _glfw.cursorPosX, _glfw.cursorPosY);
        }
        else if (newMode == GLFW_CURSOR_DISABLED)
        {
            int width, height;

            _glfw.cursorPosX = window->cursorPosX;
            _glfw.cursorPosY = window->cursorPosY;

            _glfwPlatformGetWindowSize(window, &width, &height);
            _glfwPlatformSetCursorPos(window, width / 2.0, height / 2.0);
        }

        _glfwPlatformSetCursorMode(window, newMode);
    }
}